

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O3

void multikey_cache<8u,true>(Cacheblock<8U>_conflict *cache,size_t N,size_t depth)

{
  byte *pbVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  uchar *puVar4;
  uchar *puVar5;
  int iVar6;
  uint64_t uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  size_t i;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  Cacheblock<8U>_conflict *pCVar14;
  Cacheblock<8U>_conflict *pCVar15;
  ulong uVar16;
  Cacheblock<8U>_conflict *pCVar17;
  ulong uVar18;
  ulong uVar19;
  Cacheblock<8U>_conflict *pCVar20;
  byte bVar21;
  size_t sVar22;
  ulong uVar23;
  long lVar24;
  byte bVar25;
  ulong N_00;
  ulong uVar26;
  
  if (N < 0x20) {
LAB_002254c0:
    pCVar14 = cache;
    if (1 < N) {
      do {
        puVar4 = pCVar14[1].ptr;
        for (pCVar15 = pCVar14 + 1; cache < pCVar15; pCVar15 = pCVar15 + -1) {
          puVar5 = pCVar15[-1].ptr;
          bVar21 = puVar5[depth];
          bVar25 = puVar4[depth];
          if ((bVar21 != 0) && (sVar22 = depth, bVar21 == bVar25)) {
            do {
              sVar22 = sVar22 + 1;
              bVar21 = puVar5[sVar22];
              bVar25 = puVar4[sVar22];
              if (bVar21 == 0) break;
            } while (bVar21 == bVar25);
          }
          if (bVar21 <= bVar25) break;
          pCVar15->ptr = puVar5;
        }
        iVar6 = (int)N;
        pCVar15->ptr = puVar4;
        N = (size_t)(iVar6 - 1);
        pCVar14 = pCVar14 + 1;
      } while (2 < iVar6);
    }
    return;
  }
LAB_00225146:
  uVar11 = 0;
  do {
    lVar13 = 0x40;
    uVar19 = 0;
    sVar22 = depth;
    do {
      if (lVar13 == 0) break;
      pbVar1 = cache[uVar11].ptr + sVar22;
      lVar13 = lVar13 + -8;
      uVar19 = uVar19 | (ulong)*pbVar1 << ((byte)lVar13 & 0x3f);
      sVar22 = sVar22 + 1;
    } while ((ulong)*pbVar1 != 0);
    cache[uVar11].cached_bytes = uVar19;
    uVar11 = uVar11 + 1;
  } while (uVar11 != N);
  uVar12 = N >> 3;
  uVar11 = cache->cached_bytes;
  uVar19 = cache[uVar12].cached_bytes;
  pCVar14 = cache;
  if (uVar11 != uVar19) {
    pCVar14 = cache + (N >> 2);
    uVar23 = pCVar14->cached_bytes;
    if ((uVar23 != uVar11) && (uVar23 != uVar19)) {
      if (uVar11 < uVar19) {
        if (uVar23 <= uVar11) {
          pCVar14 = cache;
        }
        if (uVar19 < uVar23) {
          pCVar14 = cache + uVar12;
        }
      }
      else {
        if (uVar11 < uVar23) {
          pCVar14 = cache;
        }
        if (uVar23 < uVar19) {
          pCVar14 = cache + uVar12;
        }
      }
    }
  }
  uVar23 = N >> 1;
  pCVar15 = cache + (uVar23 - uVar12);
  uVar11 = cache[uVar23 - uVar12].cached_bytes;
  uVar19 = cache[uVar23].cached_bytes;
  pCVar17 = pCVar15;
  if (uVar11 != uVar19) {
    pCVar20 = cache + uVar23;
    pCVar17 = pCVar20 + uVar12;
    uVar23 = pCVar17->cached_bytes;
    if ((uVar23 != uVar11) && (uVar23 != uVar19)) {
      if (uVar11 < uVar19) {
        if (uVar11 < uVar23) {
          pCVar15 = pCVar17;
        }
        pCVar17 = pCVar15;
        if (uVar19 < uVar23) {
          pCVar17 = pCVar20;
        }
      }
      else {
        if (uVar11 < uVar23) {
          pCVar17 = pCVar15;
        }
        if (uVar23 < uVar19) {
          pCVar17 = pCVar20;
        }
      }
    }
  }
  lVar24 = (N - (N >> 2)) + -1;
  pCVar15 = cache + lVar24;
  lVar13 = (N - uVar12) + -1;
  uVar11 = cache[lVar24].cached_bytes;
  uVar19 = cache[lVar13].cached_bytes;
  pCVar20 = pCVar15;
  if (uVar11 != uVar19) {
    pCVar20 = cache + (N - 3);
    uVar12 = pCVar20->cached_bytes;
    if ((uVar12 != uVar11) && (uVar12 != uVar19)) {
      if (uVar11 < uVar19) {
        if (uVar11 < uVar12) {
          pCVar15 = pCVar20;
        }
        pCVar20 = pCVar15;
        if (uVar19 < uVar12) {
          pCVar20 = cache + lVar13;
        }
      }
      else {
        if (uVar11 < uVar12) {
          pCVar20 = pCVar15;
        }
        if (uVar12 < uVar19) {
          pCVar20 = cache + lVar13;
        }
      }
    }
  }
  uVar11 = pCVar14->cached_bytes;
  uVar19 = pCVar17->cached_bytes;
  pCVar15 = pCVar14;
  if (((uVar11 != uVar19) && (uVar12 = pCVar20->cached_bytes, pCVar15 = pCVar20, uVar12 != uVar11))
     && (uVar12 != uVar19)) {
    if (uVar11 < uVar19) {
      if (uVar11 < uVar12) {
        pCVar14 = pCVar20;
      }
      pCVar15 = pCVar14;
      if (uVar19 < uVar12) {
        pCVar15 = pCVar17;
      }
    }
    else {
      if (uVar11 < uVar12) {
        pCVar20 = pCVar14;
      }
      pCVar15 = pCVar20;
      if (uVar12 < uVar19) {
        pCVar15 = pCVar17;
      }
    }
  }
  uVar26 = N - 1;
  uVar7 = cache->cached_bytes;
  puVar4 = cache->ptr;
  puVar5 = pCVar15->ptr;
  cache->cached_bytes = pCVar15->cached_bytes;
  cache->ptr = puVar5;
  pCVar15->cached_bytes = uVar7;
  pCVar15->ptr = puVar4;
  uVar12 = cache->cached_bytes;
  uVar11 = 1;
  uVar18 = 1;
  uVar23 = uVar26;
  uVar19 = uVar26;
  do {
    if (uVar18 <= uVar23) {
      pCVar14 = cache + uVar18;
      uVar16 = uVar11;
      do {
        uVar11 = uVar16;
        if (uVar12 < pCVar14->cached_bytes) break;
        if (uVar12 <= pCVar14->cached_bytes) {
          uVar11 = uVar16 + 1;
          uVar7 = cache[uVar16].cached_bytes;
          puVar4 = cache[uVar16].ptr;
          puVar5 = pCVar14->ptr;
          cache[uVar16].cached_bytes = pCVar14->cached_bytes;
          cache[uVar16].ptr = puVar5;
          pCVar14->cached_bytes = uVar7;
          pCVar14->ptr = puVar4;
        }
        uVar18 = uVar18 + 1;
        pCVar14 = pCVar14 + 1;
        uVar16 = uVar11;
      } while (uVar18 <= uVar23);
    }
    if (uVar18 <= uVar23) {
      pCVar14 = cache + uVar23;
      uVar16 = uVar19;
      do {
        uVar19 = uVar16;
        if (pCVar14->cached_bytes < uVar12) break;
        if (pCVar14->cached_bytes == uVar12) {
          uVar19 = uVar16 - 1;
          uVar7 = cache[uVar16].cached_bytes;
          puVar4 = cache[uVar16].ptr;
          puVar5 = pCVar14->ptr;
          cache[uVar16].cached_bytes = pCVar14->cached_bytes;
          cache[uVar16].ptr = puVar5;
          pCVar14->cached_bytes = uVar7;
          pCVar14->ptr = puVar4;
        }
        uVar23 = uVar23 - 1;
        pCVar14 = pCVar14 + -1;
        uVar16 = uVar19;
      } while (uVar18 <= uVar23);
    }
    if (uVar23 < uVar18) break;
    uVar7 = cache[uVar18].cached_bytes;
    puVar4 = cache[uVar18].ptr;
    puVar5 = cache[uVar23].ptr;
    cache[uVar18].cached_bytes = cache[uVar23].cached_bytes;
    cache[uVar18].ptr = puVar5;
    cache[uVar23].cached_bytes = uVar7;
    cache[uVar23].ptr = puVar4;
    uVar18 = uVar18 + 1;
    uVar23 = uVar23 - 1;
  } while( true );
  N_00 = uVar18 - uVar11;
  uVar16 = uVar11;
  if (N_00 < uVar11) {
    uVar16 = N_00;
  }
  if (uVar16 != 0) {
    lVar13 = 0;
    do {
      puVar2 = (undefined8 *)((long)&cache->cached_bytes + lVar13);
      uVar8 = *puVar2;
      uVar9 = puVar2[1];
      puVar2 = (undefined8 *)((long)&cache[uVar18 - uVar16].cached_bytes + lVar13);
      uVar10 = puVar2[1];
      puVar3 = (undefined8 *)((long)&cache->cached_bytes + lVar13);
      *puVar3 = *puVar2;
      puVar3[1] = uVar10;
      puVar2 = (undefined8 *)((long)&cache[uVar18 - uVar16].cached_bytes + lVar13);
      *puVar2 = uVar8;
      puVar2[1] = uVar9;
      lVar13 = lVar13 + 0x10;
    } while (uVar16 * 0x10 != lVar13);
  }
  uVar26 = uVar26 - uVar19;
  uVar19 = uVar19 - uVar23;
  uVar23 = uVar26;
  if (uVar19 < uVar26) {
    uVar23 = uVar19;
  }
  if (uVar23 != 0) {
    lVar13 = 0;
    do {
      puVar2 = (undefined8 *)((long)&cache[uVar18].cached_bytes + lVar13);
      uVar8 = *puVar2;
      uVar9 = puVar2[1];
      puVar2 = (undefined8 *)((long)&cache[N - uVar23].cached_bytes + lVar13);
      uVar10 = puVar2[1];
      puVar3 = (undefined8 *)((long)&cache[uVar18].cached_bytes + lVar13);
      *puVar3 = *puVar2;
      puVar3[1] = uVar10;
      puVar2 = (undefined8 *)((long)&cache[N - uVar23].cached_bytes + lVar13);
      *puVar2 = uVar8;
      puVar2[1] = uVar9;
      lVar13 = lVar13 + 0x10;
    } while (uVar23 * 0x10 != lVar13);
  }
  N = uVar26 + uVar11;
  multikey_cache<8u,false>(cache,N_00,depth);
  cache = cache + N_00;
  multikey_cache<8u,false>(cache + N,uVar19,depth);
  if ((char)uVar12 == '\0') {
    return;
  }
  depth = depth + 8;
  if (N < 0x20) goto LAB_002254c0;
  goto LAB_00225146;
}

Assistant:

static void
multikey_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	if (N < 32) {
		if (N==0) return;
		if (CacheDirty) {
			insertion_sort(cache, N, depth);
			return;
		}
		inssort_cache_block(cache, N);
		size_t start=0, cnt=1;
		for (size_t i=0; i < N-1; ++i) {
			if (Cmp()(cache[i], cache[i+1]) == 0) {
				++cnt;
				continue;
			}
			if (cnt > 1 and cache[start].cached_bytes & 0xFF)
				insertion_sort(cache+start, cnt,
						depth+CachedChars);
			cnt = 1;
			start = i+1;
		}
		if (cnt > 1 and cache[start].cached_bytes & 0xFF)
			insertion_sort(cache+start, cnt, depth+CachedChars);
		return;
	}
	if (CacheDirty) {
		fill_cache(cache, N, depth);
	}
	// Move pivot to first position to avoid wrapping the unsigned values
	// we are using in the main loop from zero to max.
	std::swap(cache[0], med3char(
		med3char(cache[0],       cache[N/8],     cache[N/4],    Cmp()),
		med3char(cache[N/2-N/8], cache[N/2],     cache[N/2+N/8],Cmp()),
		med3char(cache[N-1-N/4], cache[N-1-N/8], cache[N-3],    Cmp()),
		Cmp()));
	Cacheblock<CachedChars> partval = cache[0];
	size_t first   = 1;
	size_t last    = N-1;
	size_t beg_ins = 1;
	size_t end_ins = N-1;
	while (true) {
		while (first <= last) {
			const int res = Cmp()(cache[first], partval);
			if (res > 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[beg_ins++], cache[first]);
			}
			++first;
		}
		while (first <= last) {
			const int res = Cmp()(cache[last], partval);
			if (res < 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[end_ins--], cache[last]);
			}
			--last;
		}
		if (first > last)
			break;
		std::swap(cache[first], cache[last]);
		++first;
		--last;
	}
	// Some calculations to make the code more readable.
	const size_t num_eq_beg = beg_ins;
	const size_t num_eq_end = N-1-end_ins;
	const size_t num_eq     = num_eq_beg+num_eq_end;
	const size_t num_lt     = first-beg_ins;
	const size_t num_gt     = end_ins-last;
	// Swap the equal pointers from the beginning to proper position.
	const size_t size1 = std::min(num_eq_beg, num_lt);
	std::swap_ranges(cache, cache+size1, cache+first-size1);
	// Swap the equal pointers from the end to proper position.
	const size_t size2 = std::min(num_eq_end, num_gt);
	std::swap_ranges(cache+first, cache+first+size2, cache+N-size2);
	// Now recurse.
	multikey_cache<CachedChars, false>(cache, num_lt, depth);
	multikey_cache<CachedChars, false>(cache+num_lt+num_eq, num_gt, depth);
	if (partval.cached_bytes & 0xFF)
		multikey_cache<CachedChars, true>(
			cache+num_lt, num_eq, depth+CachedChars);
}